

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  string *psVar1;
  string *psVar2;
  undefined1 *this_00;
  cmCTest *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pcVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  rep rVar11;
  long lVar12;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  char *pcVar14;
  long lVar15;
  pointer pcVar16;
  char *pcVar17;
  char **ppcVar18;
  cmDuration cVar19;
  int retVal;
  char *local_718 [4];
  cmXMLWriter xml;
  string srcdirrep;
  string local_520;
  string makeCommand;
  cmGeneratedFileStream xofs;
  string local_298;
  cmGeneratedFileStream ofs;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
  poVar10 = std::operator<<((ostream *)&ofs,"Build project");
  std::endl<char,std::char_traits<char>>(poVar10);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x11d,(char *)xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                              ._vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&xofs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  cVar19 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar9 = 0;
  if (120.0 <= cVar19.__r) {
    this_00 = &xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    for (lVar12 = 8; lVar12 != 0x78; lVar12 = lVar12 + 0x10) {
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._88_8_ = 0;
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._168_8_ = 0;
      pcVar14 = *(char **)((long)&PTR__cmCTestBuildHandler_005e04d8 + lVar12);
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._200_8_ = 0;
      bVar7 = cmsys::RegularExpression::compile((RegularExpression *)this_00,pcVar14);
      if (bVar7) {
        xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             *(_func_int ***)
              ((long)&cmCTestWarningErrorFileLine[0].RegularExpressionString + lVar12);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>
                  (&this->ErrorWarningFileLineRegex,(cmCTestCompileErrorWarningRex *)&xofs);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar10 = std::operator<<((ostream *)&ofs,"Problem Compiling regular expression: ");
        poVar10 = std::operator<<(poVar10,pcVar14);
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x132,srcdirrep._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)this_00);
    }
    GetMakeCommand_abi_cxx11_(&makeCommand,this);
    if (makeCommand._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
      poVar10 = std::operator<<((ostream *)&ofs,
                                "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x13b,(char *)xofs.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream,false);
      std::__cxx11::string::~string((string *)&xofs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      iVar9 = -1;
    }
    else {
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofs,"BuildDirectory",(allocator<char> *)&xofs);
      cmCTest::GetCTestConfiguration(&local_520,pcVar3,(string *)&ofs);
      std::__cxx11::string::~string((string *)&ofs);
      if (local_520._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar10 = std::operator<<((ostream *)&ofs,
                                  "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x144,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
        iVar9 = -1;
      }
      else {
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ofs,"UseLaunchers",(allocator<char> *)&xofs);
        cmCTest::GetCTestConfiguration(&local_298,pcVar3,(string *)&ofs);
        std::__cxx11::string::~string((string *)&ofs);
        bVar7 = cmSystemTools::IsOn(&local_298);
        this->UseCTestLaunch = bVar7;
        cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
        lVar12 = std::chrono::_V2::steady_clock::now();
        bVar7 = cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Build",&ofs)
        ;
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar10 = std::operator<<((ostream *)&xofs,"Cannot create build log file");
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x151,srcdirrep._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        }
        for (ppcVar18 = cmCTestErrorMatches; *ppcVar18 != (char *)0x0; ppcVar18 = ppcVar18 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,ppcVar18);
        }
        for (ppcVar18 = cmCTestErrorExceptions; *ppcVar18 != (char *)0x0; ppcVar18 = ppcVar18 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,ppcVar18);
        }
        for (ppcVar18 = cmCTestWarningMatches; *ppcVar18 != (char *)0x0; ppcVar18 = ppcVar18 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,ppcVar18);
        }
        for (ppcVar18 = cmCTestWarningExceptions; *ppcVar18 != (char *)0x0; ppcVar18 = ppcVar18 + 1)
        {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,ppcVar18);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar10 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar10 = std::operator<<(poVar10,"Add this->ErrorMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x175,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar4 = (this->CustomErrorMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = (this->CustomErrorMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
            pbVar13 = pbVar13 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar10 = std::operator<<((ostream *)&xofs,"Add this->CustomErrorMatches: ");
          poVar10 = std::operator<<(poVar10,(string *)pbVar13);
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x175,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorMatchRegex,pbVar13);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar10 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar10 = std::operator<<(poVar10,"Add this->ErrorExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x177,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar4 = (this->CustomErrorExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = (this->CustomErrorExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
            pbVar13 = pbVar13 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar10 = std::operator<<((ostream *)&xofs,"Add this->CustomErrorExceptions: ");
          poVar10 = std::operator<<(poVar10,(string *)pbVar13);
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x177,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorExceptionRegex,pbVar13);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar10 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar10 = std::operator<<(poVar10,"Add this->WarningMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x179,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar4 = (this->CustomWarningMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = (this->CustomWarningMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
            pbVar13 = pbVar13 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar10 = std::operator<<((ostream *)&xofs,"Add this->CustomWarningMatches: ");
          poVar10 = std::operator<<(poVar10,(string *)pbVar13);
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x179,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningMatchRegex,pbVar13);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar10 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar10 = std::operator<<(poVar10,"Add this->WarningExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x17b,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar4 = (this->CustomWarningExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = (this->CustomWarningExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
            pbVar13 = pbVar13 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar10 = std::operator<<((ostream *)&xofs,"Add this->CustomWarningExceptions: ");
          poVar10 = std::operator<<(poVar10,(string *)pbVar13);
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x17b,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningExceptionRegex,pbVar13);
        }
        (this->SimplifySourceDir)._M_string_length = 0;
        *(this->SimplifySourceDir)._M_dataplus._M_p = '\0';
        (this->SimplifyBuildDir)._M_string_length = 0;
        *(this->SimplifyBuildDir)._M_dataplus._M_p = '\0';
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcdirrep,"SourceDirectory",(allocator<char> *)&xml);
        cmCTest::GetCTestConfiguration((string *)&xofs,pcVar3,&srcdirrep);
        uVar6 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        psVar1 = &this->SimplifySourceDir;
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::string::~string((string *)&srcdirrep);
        if (0x14 < (ulong)uVar6) {
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&xml,"SourceDirectory",(allocator<char> *)local_718);
          cmCTest::GetCTestConfiguration(&srcdirrep,pcVar3,(string *)&xml);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         &srcdirrep,"/");
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xml);
          srcdirrep._M_dataplus._M_p = (pointer)&srcdirrep.field_2;
          srcdirrep._M_string_length = 0;
          srcdirrep.field_2._M_local_buf[0] = '\0';
          pcVar14 = (char *)((long)xofs.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream +
                            xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _8_8_ + -2);
          lVar15 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
          while (lVar15 = lVar15 + -1, lVar15 != 1) {
            if (*pcVar14 == '/') {
              std::__cxx11::string::assign((char *)&srcdirrep);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &xml,"/...",&srcdirrep);
              std::__cxx11::string::operator=((string *)&srcdirrep,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              std::__cxx11::string::substr((ulong)&xml,(ulong)&xofs);
              std::__cxx11::string::operator=((string *)&xofs,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              break;
            }
            pcVar14 = pcVar14 + -1;
          }
          std::__cxx11::string::_M_assign((string *)psVar1);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xofs);
        }
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcdirrep,"BuildDirectory",(allocator<char> *)&xml);
        cmCTest::GetCTestConfiguration((string *)&xofs,pcVar3,&srcdirrep);
        uVar6 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        psVar2 = &this->SimplifyBuildDir;
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::string::~string((string *)&srcdirrep);
        if (0x14 < (ulong)uVar6) {
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&xml,"BuildDirectory",(allocator<char> *)local_718);
          cmCTest::GetCTestConfiguration(&srcdirrep,pcVar3,(string *)&xml);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         &srcdirrep,"/");
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xml);
          srcdirrep._M_dataplus._M_p = (pointer)&srcdirrep.field_2;
          srcdirrep._M_string_length = 0;
          srcdirrep.field_2._M_local_buf[0] = '\0';
          pcVar14 = (char *)((long)xofs.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream +
                            xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _8_8_ + -2);
          lVar15 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
          while (lVar15 = lVar15 + -1, lVar15 != 1) {
            if (*pcVar14 == '/') {
              std::__cxx11::string::assign((char *)&srcdirrep);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &xml,"/...",&srcdirrep);
              std::__cxx11::string::operator=((string *)&srcdirrep,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              std::__cxx11::string::substr((ulong)&xml,(ulong)&xofs);
              std::__cxx11::string::operator=((string *)&xofs,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              break;
            }
            pcVar14 = pcVar14 + -1;
          }
          std::__cxx11::string::_M_assign((string *)psVar2);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xofs);
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        rVar11 = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = rVar11;
        retVal = 0;
        bVar7 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar10 = std::operator<<((ostream *)&xofs,"Build with command: ");
          poVar10 = std::operator<<(poVar10,(string *)&makeCommand);
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1aa,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          bVar7 = false;
        }
        else {
          iVar9 = RunMakeCommand(this,&makeCommand,&retVal,local_520._M_dataplus._M_p,0,
                                 (ostream *)&ofs,Auto);
          bVar7 = iVar9 != 4;
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        rVar11 = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = rVar11;
        lVar15 = std::chrono::_V2::steady_clock::now();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          pcVar5 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar16 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar16 != pcVar5;
              pcVar16 = pcVar16 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar16->Text,(psVar1->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar16->PreContext,(psVar1->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar16->PostContext,(psVar1->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          pcVar5 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar16 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar16 != pcVar5;
              pcVar16 = pcVar16 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar16->Text,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar16->PreContext,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar16->PostContext,(psVar2->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream(&xofs,None);
        bVar8 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",&xofs);
        if (bVar8) {
          cmXMLWriter::cmXMLWriter(&xml,(ostream *)&xofs,0);
          GenerateXMLHeader(this,&xml);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,&xml);
          }
          else {
            GenerateXMLLogScraped(this,&xml);
          }
          GenerateXMLFooter(this,&xml,(cmDuration)((double)(lVar15 - lVar12) / 1000000000.0));
          if ((bVar7 || retVal != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
            poVar10 = std::operator<<((ostream *)&srcdirrep,"Error(s) when building project");
            std::endl<char,std::char_traits<char>>(poVar10);
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1dc,local_718[0],false);
            std::__cxx11::string::~string((string *)local_718);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
          poVar10 = std::operator<<((ostream *)&srcdirrep,"   ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->TotalErrors);
          pcVar17 = " or more";
          pcVar14 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar14 = "";
          }
          poVar10 = std::operator<<(poVar10,pcVar14);
          poVar10 = std::operator<<(poVar10," Compiler errors");
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e3,local_718[0],false);
          std::__cxx11::string::~string((string *)local_718);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
          poVar10 = std::operator<<((ostream *)&srcdirrep,"   ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar17 = "";
          }
          poVar10 = std::operator<<(poVar10,pcVar17);
          poVar10 = std::operator<<(poVar10," Compiler warnings");
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e8,local_718[0],false);
          std::__cxx11::string::~string((string *)local_718);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          iVar9 = retVal;
          cmXMLWriter::~cmXMLWriter(&xml);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
          poVar10 = std::operator<<((ostream *)&srcdirrep,"Cannot create build XML file");
          std::endl<char,std::char_traits<char>>(poVar10);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ce,(char *)xml.Output,false);
          std::__cxx11::string::~string((string *)&xml);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          iVar9 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&xofs);
        cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
        std::__cxx11::string::~string((string *)&local_298);
      }
      std::__cxx11::string::~string((string *)&local_520);
    }
    std::__cxx11::string::~string((string *)&makeCommand);
  }
  return iVar9;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmSystemTools::IsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    std::string srcdirrep;
    for (cc = srcdir.size() - 2; cc > 0; cc--) {
      if (srcdir[cc] == '/') {
        srcdirrep = srcdir.c_str() + cc;
        srcdirrep = "/..." + srcdirrep;
        srcdir = srcdir.substr(0, cc + 1);
        break;
      }
    }
    this->SimplifySourceDir = srcdir;
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    std::string bindirrep;
    for (cc = bindir.size() - 2; cc > 0; cc--) {
      if (bindir[cc] == '/') {
        bindirrep = bindir.c_str() + cc;
        bindirrep = "/..." + bindirrep;
        bindir = bindir.substr(0, cc + 1);
        break;
      }
    }
    this->SimplifyBuildDir = bindir;
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}